

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleScrollAdapter.cpp
# Opt level: O2

void __thiscall cursespp::SimpleScrollAdapter::SimpleScrollAdapter(SimpleScrollAdapter *this)

{
  _Rb_tree_header *p_Var1;
  
  ScrollAdapterBase::ScrollAdapterBase(&this->super_ScrollAdapterBase);
  (this->super_ScrollAdapterBase).super_IScrollAdapter._vptr_IScrollAdapter =
       (_func_int **)&PTR__SimpleScrollAdapter_001c15f0;
  sigslot::signal1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>::signal1
            (&this->Changed);
  (this->indexToColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->indexToColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->indexToColor)._M_t._M_impl.super__Rb_tree_header;
  (this->indexToColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->indexToColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->indexToColor)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  ::_Deque_base(&(this->entries).
                 super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
               );
  this->maxEntries = 0xffffffff;
  this->selectable = false;
  return;
}

Assistant:

SimpleScrollAdapter::SimpleScrollAdapter() {
    this->maxEntries = MAX_ENTRY_COUNT;
    this->selectable = false;
}